

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directive.cpp
# Opt level: O1

string * __thiscall ast::Dir_byte::listing_abi_cxx11_(string *__return_storage_ptr__,Dir_byte *this)

{
  uint uVar1;
  uint uVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  
  uVar1 = (this->super_Directive).super_Statement.location.line;
  uVar2 = (this->super_Directive).super_Statement.size_in_memory;
  if (uVar2 == 2) {
    uVar5 = Sections::get_address((this->super_Directive).super_Statement.section_index);
    uVar2 = (this->super_Directive).super_Statement.section_offset;
    bVar3 = Sections::read8((this->super_Directive).super_Statement.section_index,uVar2);
    bVar4 = Sections::read8((this->super_Directive).super_Statement.section_index,
                            (this->super_Directive).super_Statement.section_offset + 1);
    string_printf_abi_cxx11_
              (__return_storage_ptr__,"%4d %04X %02X %02X\t",(ulong)uVar1,(ulong)(uVar5 + uVar2),
               (ulong)bVar3,(ulong)bVar4);
  }
  else if (uVar2 == 1) {
    uVar5 = Sections::get_address((this->super_Directive).super_Statement.section_index);
    uVar2 = (this->super_Directive).super_Statement.section_offset;
    bVar3 = Sections::read8((this->super_Directive).super_Statement.section_index,uVar2);
    string_printf_abi_cxx11_
              (__return_storage_ptr__,"%4d %04X %02X\t",(ulong)uVar1,(ulong)(uVar5 + uVar2),
               (ulong)bVar3);
  }
  else {
    string_printf_abi_cxx11_(__return_storage_ptr__,"%4d          \t",(ulong)uVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

string Dir_byte::listing()
{
	switch (size_in_memory) {
	case 1:
		return string_printf("%4d %04X %02X\t", location.line,
			Sections::get_address(section_index) + section_offset,
			Sections::read8(section_index, section_offset));
	case 2:
		return string_printf("%4d %04X %02X %02X\t", location.line,
			Sections::get_address(section_index) + section_offset,
			Sections::read8(section_index, section_offset),
			Sections::read8(section_index, section_offset + 1));
	default:
		return string_printf("%4d          \t", location.line);
	}
}